

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

type __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
::operator()(arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
             *this,longdouble value)

{
  long in_RSI;
  ostream_type *in_RDI;
  iterator iVar1;
  type tVar2;
  arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *in_stack_00000008;
  format_specs *in_stack_00000288;
  longdouble in_stack_00000290;
  basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *in_stack_000002a0;
  undefined2 in_stack_ffffffffffffff90;
  undefined6 in_stack_ffffffffffffff92;
  
  if (*(long *)(in_RSI + 0x18) == 0) {
    basic_format_specs<char>::basic_format_specs
              ((basic_format_specs<char> *)
               CONCAT62(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90));
  }
  basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  ::write_double<long_double>(in_stack_000002a0,in_stack_00000290,in_stack_00000288);
  iVar1 = arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
          ::out(in_stack_00000008);
  tVar2._M_string = iVar1._M_string;
  tVar2._M_stream = in_RDI;
  return tVar2;
}

Assistant:

typename std::enable_if<std::is_floating_point<T>::value, iterator>::type
      operator()(T value) {
    writer_.write_double(value, specs_ ? *specs_ : format_specs());
    return out();
  }